

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float __thiscall
ImGui::ScaleRatioFromValueT<int,int,float>
          (ImGui *this,ImGuiDataType data_type,int v,int v_min,int v_max,bool is_logarithmic,
          float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = 0.0;
  iVar2 = v_min - v;
  if (iVar2 != 0) {
    iVar3 = v_min;
    if (iVar2 != 0 && v <= v_min) {
      iVar3 = v;
    }
    iVar1 = v_min;
    if (v_min < v) {
      iVar1 = v;
    }
    if (data_type < iVar1) {
      iVar1 = data_type;
    }
    if (data_type < iVar3) {
      iVar1 = iVar3;
    }
    if ((char)v_max == '\0') {
      fVar8 = (float)(iVar1 - v) / (float)iVar2;
    }
    else {
      iVar2 = v;
      if (v_min < v) {
        iVar2 = v_min;
      }
      iVar3 = v;
      if (v < v_min) {
        iVar3 = v_min;
      }
      fVar5 = (float)iVar2;
      fVar7 = fVar5;
      if ((ABS(fVar5) < logarithmic_zero_epsilon) && (fVar7 = logarithmic_zero_epsilon, iVar2 < 0))
      {
        fVar7 = -logarithmic_zero_epsilon;
      }
      fVar6 = (float)iVar3;
      fVar9 = fVar6;
      if ((ABS(fVar6) < logarithmic_zero_epsilon) && (fVar9 = logarithmic_zero_epsilon, iVar3 < 0))
      {
        fVar9 = -logarithmic_zero_epsilon;
      }
      if (iVar3 < 0 && iVar2 == 0) {
        fVar7 = -logarithmic_zero_epsilon;
      }
      else if (iVar2 < 0 && iVar3 == 0) {
        fVar9 = -logarithmic_zero_epsilon;
      }
      fVar4 = (float)iVar1;
      if (fVar7 < fVar4) {
        if (fVar9 <= fVar4) {
          fVar8 = 1.0;
        }
        else if (v_min * v < 0) {
          fVar8 = -fVar5 / (fVar6 - fVar5);
          if (data_type != 0) {
            if (data_type < 0) {
              fVar5 = logf(-fVar4 / logarithmic_zero_epsilon);
              fVar7 = logf(-fVar7 / logarithmic_zero_epsilon);
              fVar8 = (fVar8 - zero_deadzone_halfsize) * (1.0 - fVar5 / fVar7);
            }
            else {
              fVar7 = logf(fVar4 / logarithmic_zero_epsilon);
              fVar5 = logf(fVar9 / logarithmic_zero_epsilon);
              fVar8 = fVar8 + zero_deadzone_halfsize +
                      (1.0 - (fVar8 + zero_deadzone_halfsize)) * (fVar7 / fVar5);
            }
          }
        }
        else if ((v_min | v) < 0) {
          fVar8 = logf(fVar4 / fVar9);
          fVar7 = logf(fVar7 / fVar9);
          fVar8 = 1.0 - fVar8 / fVar7;
        }
        else {
          fVar8 = logf(fVar4 / fVar7);
          fVar7 = logf(fVar9 / fVar7);
          fVar8 = fVar8 / fVar7;
        }
      }
      if (v_min < v) {
        fVar8 = 1.0 - fVar8;
      }
    }
  }
  return fVar8;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}